

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  in_R8;
  buffer<char> *c;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args;
  string_view message_00;
  char *system_message;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined **local_270 [2];
  size_t local_260;
  size_t local_258;
  buffer<char> *local_250;
  undefined **local_248;
  char *local_240;
  size_t sStack_238;
  ulong local_230;
  char local_228 [504];
  
  message_00.data_ = (char *)message.size_;
  local_240 = local_228;
  local_248 = &PTR_grow_00137bd8;
  local_230 = 500;
  sStack_238 = 500;
  do {
    local_2a0 = local_240;
    iVar3 = detail::safe_strerror(error_code,&local_2a0,sStack_238);
    if (iVar3 == 0x22) {
      uVar1 = sStack_238 * 2;
      if (local_230 < uVar1) {
        (*(code *)*local_248)(&local_248,uVar1);
      }
      iVar3 = 0;
      bVar2 = true;
      sStack_238 = uVar1;
    }
    else {
      if (iVar3 == 0) {
        local_288 = local_2a0;
        local_260 = out->size_;
        local_270[0] = &PTR_grow_00138c58;
        in_R8.values_ =
             (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
              *)&local_298;
        format_str.size_ = 6;
        format_str.data_ = "{}: {}";
        args.field_1.values_ = in_R8.values_;
        args.desc_ = 0xcd;
        local_298 = message.data_;
        local_290 = message_00.data_;
        local_258 = local_260;
        local_250 = out;
        vformat_to<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                  ((buffer<char> *)local_270,format_str,args,(locale_ref)0x0);
        iVar3 = 1;
      }
      else {
        iVar3 = 2;
      }
      bVar2 = false;
    }
  } while (iVar3 == 0);
  if (iVar3 == 2) {
    bVar2 = true;
  }
  local_248 = &PTR_grow_00137bd8;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  if (bVar2) {
    message_00.size_ = (size_t)in_R8.values_;
    detail::format_error_code
              ((detail *)out,(buffer<char> *)(ulong)(uint)error_code,(int)message.data_,message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(std::back_inserter(out), "{}: {}", message, system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }